

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset_inline.hpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::indset::iteration<Omega_h::QualityCompare>
          (indset *this,Mesh *mesh,Int dim,LOs *xadj,LOs *adj,Read<signed_char> *old_state,
          QualityCompare *compare)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> local_c0;
  undefined1 local_a9;
  QualityCompare local_a8;
  Read<signed_char> local_88 [2];
  Read<int> local_68;
  Read<int> local_58;
  undefined1 local_48 [8];
  Read<signed_char> local_state;
  Read<signed_char> *old_state_local;
  LOs *adj_local;
  LOs *xadj_local;
  Int dim_local;
  Mesh *mesh_local;
  Read<signed_char> *synced_state;
  
  local_state.write_.shared_alloc_.direct_ptr = old_state;
  Read<int>::Read(&local_58,xadj);
  Read<int>::Read(&local_68,adj);
  Read<signed_char>::Read(local_88,old_state);
  QualityCompare::QualityCompare(&local_a8,compare);
  local_iteration<Omega_h::QualityCompare>
            ((indset *)local_48,&local_58,&local_68,local_88,&local_a8);
  QualityCompare::~QualityCompare(&local_a8);
  Read<signed_char>::~Read(local_88);
  Read<int>::~Read(&local_68);
  Read<int>::~Read(&local_58);
  local_a9 = 0;
  Read<signed_char>::Read(&local_c0,(Read<signed_char> *)local_48);
  Omega_h::Mesh::sync_array<signed_char>
            ((Mesh *)this,(Int)mesh,(Read<signed_char> *)(ulong)(uint)dim,(Int)&local_c0);
  Read<signed_char>::~Read(&local_c0);
  local_a9 = 1;
  Read<signed_char>::~Read((Read<signed_char> *)local_48);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> iteration(Mesh* mesh, Int dim, LOs xadj, LOs adj, Read<I8> old_state,
    Compare compare) {
  auto local_state = local_iteration(xadj, adj, old_state, compare);
  auto synced_state = mesh->sync_array(dim, local_state, 1);
  return synced_state;
}